

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

void HFSubConsumer::ringbufController(zsock_t *pipe,void *args)

{
  char *pcVar1;
  zsock_t *self;
  char *__s;
  zloop_t *self_00;
  zloop_t *loop;
  zloop_t *local_38;
  
  *(zsock_t **)((long)args + 0xa0) = pipe;
  self = zsock_new_checked(4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                           ,0xc6);
  *(zsock_t **)((long)args + 0x388) = self;
  zsock_bind(self,"inproc://rep_%p",args);
  __s = zsock_endpoint(*(zsock_t **)((long)args + 0x388));
  pcVar1 = *(char **)((long)args + 0x398);
  strlen(__s);
  std::__cxx11::string::_M_replace((long)args + 0x390,0,pcVar1,(ulong)__s);
  zsock_signal(pipe,'\0');
  self_00 = zloop_new();
  local_38 = self_00;
  zloop_reader(self_00,pipe,HighFreqSub::pipeController,args);
  (**(code **)(*args + 0x20))(args,self_00);
  zloop_start(self_00);
  zloop_destroy(&local_38);
  zsock_destroy_checked
            ((zsock_t **)((long)args + 0x388),
             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
             ,0xd1);
  zsock_signal(pipe,'\0');
  return;
}

Assistant:

void HFSubConsumer::ringbufController(zsock_t *pipe, void *args){
    HFSubConsumer *self = (HFSubConsumer*)args;
    self->usrpipe = pipe;

    //Bind rep to custom endpoint
    self->rep = zsock_new(ZMQ_REP);
    zsock_bind(self->rep, "inproc://rep_%p", args);
    self->rependpoint = zsock_endpoint(self->rep);

    //Initialize loop
    zsock_signal(pipe, 0);
    zloop_t *loop = zloop_new();
    zloop_reader(loop, pipe, pipeController, self);
    self->sub_reader(loop);
    zloop_start(loop);
    zloop_destroy(&loop);
    zsock_destroy(&self->rep);
    zsock_signal(pipe, 0);
}